

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O2

int arkStep_NlsResidual_MassTDep(N_Vector zcor,N_Vector r,void *arkode_mem)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  
  iVar1 = arkStep_AccessARKODEStepMem(arkode_mem,"arkStep_NlsResidual_MassTDep",&ark_mem,&step_mem);
  if (iVar1 == 0) {
    N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,step_mem->zpred,zcor,ark_mem->ycur);
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,zcor,step_mem->sdata,
                 step_mem->Fi[step_mem->istage]);
    iVar1 = (*step_mem->mmult)(ark_mem,step_mem->Fi[step_mem->istage],r);
    if (iVar1 == 0) {
      iVar1 = (*step_mem->nls_fi)(ark_mem->tcur,ark_mem->ycur,step_mem->Fi[step_mem->istage],
                                  ark_mem->user_data);
      step_mem->nfi = step_mem->nfi + 1;
      if (iVar1 < 0) {
        iVar1 = -8;
      }
      else if (iVar1 == 0) {
        N_VLinearSum(0x3ff0000000000000,-step_mem->gamma,r,step_mem->Fi[step_mem->istage],r);
        iVar1 = 0;
      }
      else {
        iVar1 = 9;
      }
    }
    else {
      iVar1 = -0x12;
    }
  }
  return iVar1;
}

Assistant:

int arkStep_NlsResidual_MassTDep(N_Vector zcor, N_Vector r, void* arkode_mem)
{
  /* temporary variables */
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeARKStepMem structures */
  retval = arkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* update 'ycur' value as stored predictor + current corrector */
  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, ark_mem->ycur);

  /* put M*(zcor - sdata) in r (use Fi[is] as temporary storage) */
  N_VLinearSum(ONE, zcor, -ONE, step_mem->sdata, step_mem->Fi[step_mem->istage]);
  retval = step_mem->mmult((void*)ark_mem, step_mem->Fi[step_mem->istage], r);
  if (retval != ARK_SUCCESS) { return (ARK_MASSMULT_FAIL); }

  /* compute implicit RHS */
  retval = step_mem->nls_fi(ark_mem->tcur, ark_mem->ycur,
                            step_mem->Fi[step_mem->istage], ark_mem->user_data);
  step_mem->nfi++;
  if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
  if (retval > 0) { return (RHSFUNC_RECVR); }

  /* compute residual via linear sum */
  N_VLinearSum(ONE, r, -step_mem->gamma, step_mem->Fi[step_mem->istage], r);
  return (ARK_SUCCESS);
}